

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<8,_1,_false,_embree::avx2::SubGridIntersector1Moeller<8,_true>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  RTCIntersectArguments *pRVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined4 uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  byte bVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong unaff_R12;
  size_t mask;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar52;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar61;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined8 uVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  __m128 a;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  uint uVar91;
  uint uVar92;
  uint uVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar90 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [564];
  int local_15f4;
  RTCRayQueryContext *local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  ulong *local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  ulong local_1580;
  ulong local_1578;
  ulong local_1570;
  ulong local_1568;
  ulong local_1560;
  ulong local_1558;
  Scene *local_1550;
  long local_1548;
  undefined4 local_1540;
  undefined4 local_153c;
  undefined4 local_1538;
  float local_1534;
  float local_1530;
  undefined4 local_152c;
  undefined4 local_1528;
  uint local_1524;
  uint local_1520;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1320 [32];
  float local_1300 [4];
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar72 = ray->tfar;
    if (0.0 <= fVar72) {
      local_15b0 = local_1200 + 1;
      auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar1 = (ray->dir).field_0;
      auVar76._8_4_ = 0x7fffffff;
      auVar76._0_8_ = 0x7fffffff7fffffff;
      auVar76._12_4_ = 0x7fffffff;
      auVar76 = vandps_avx((undefined1  [16])aVar1,auVar76);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar76 = vcmpps_avx(auVar76,auVar78,1);
      auVar76 = vblendvps_avx((undefined1  [16])aVar1,auVar78,auVar76);
      auVar78 = vrcpps_avx(auVar76);
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = &DAT_3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar76 = vfnmadd231ps_fma(auVar79,auVar78,auVar76);
      auVar17 = vfmadd132ps_fma(auVar76,auVar78,auVar78);
      fVar61 = auVar17._0_4_;
      local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar113 = ZEXT3264(CONCAT428(fVar61,CONCAT424(fVar61,CONCAT420(fVar61,CONCAT416(fVar61,
                                                  CONCAT412(fVar61,CONCAT48(fVar61,CONCAT44(fVar61,
                                                  fVar61))))))));
      auVar76 = vmovshdup_avx(auVar17);
      uVar73 = auVar76._0_8_;
      local_1400._8_8_ = uVar73;
      local_1400._0_8_ = uVar73;
      local_1400._16_8_ = uVar73;
      local_1400._24_8_ = uVar73;
      auVar89 = ZEXT3264(local_1400);
      auVar79 = vshufpd_avx(auVar17,auVar17,1);
      auVar78 = vshufps_avx(auVar17,auVar17,0xaa);
      uVar73 = auVar78._0_8_;
      local_1420._8_8_ = uVar73;
      local_1420._0_8_ = uVar73;
      local_1420._16_8_ = uVar73;
      local_1420._24_8_ = uVar73;
      auVar90 = ZEXT3264(local_1420);
      auVar80._0_4_ = fVar61 * (ray->org).field_0.m128[0];
      auVar80._4_4_ = auVar17._4_4_ * (ray->org).field_0.m128[1];
      auVar80._8_4_ = auVar17._8_4_ * (ray->org).field_0.m128[2];
      auVar80._12_4_ = auVar17._12_4_ * (ray->org).field_0.m128[3];
      auVar78 = vmovshdup_avx(auVar80);
      auVar17 = vshufps_avx(auVar80,auVar80,0xaa);
      uVar30 = (ulong)(fVar61 < 0.0) << 5;
      uVar37 = (ulong)(auVar76._0_4_ < 0.0) << 5 | 0x40;
      uVar38 = (ulong)(auVar79._0_4_ < 0.0) << 5 | 0x80;
      uVar39 = uVar30 ^ 0x20;
      uVar36 = uVar37 ^ 0x20;
      uVar43 = uVar38 ^ 0x20;
      uVar27 = auVar14._0_4_;
      local_1440._4_4_ = uVar27;
      local_1440._0_4_ = uVar27;
      local_1440._8_4_ = uVar27;
      local_1440._12_4_ = uVar27;
      local_1440._16_4_ = uVar27;
      local_1440._20_4_ = uVar27;
      local_1440._24_4_ = uVar27;
      local_1440._28_4_ = uVar27;
      auVar100 = ZEXT3264(local_1440);
      local_1460._4_4_ = fVar72;
      local_1460._0_4_ = fVar72;
      local_1460._8_4_ = fVar72;
      local_1460._12_4_ = fVar72;
      local_1460._16_4_ = fVar72;
      local_1460._20_4_ = fVar72;
      local_1460._24_4_ = fVar72;
      local_1460._28_4_ = fVar72;
      auVar104 = ZEXT3264(local_1460);
      uVar40 = CONCAT44(auVar80._0_4_,auVar80._0_4_);
      local_1480._0_8_ = uVar40 ^ 0x8000000080000000;
      local_1480._8_4_ = -auVar80._0_4_;
      local_1480._12_4_ = -auVar80._0_4_;
      local_1480._16_4_ = -auVar80._0_4_;
      local_1480._20_4_ = -auVar80._0_4_;
      local_1480._24_4_ = -auVar80._0_4_;
      local_1480._28_4_ = -auVar80._0_4_;
      auVar106 = ZEXT3264(local_1480);
      uVar28 = auVar78._0_4_;
      uVar35 = auVar78._4_4_;
      local_14a0._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
      local_14a0._8_4_ = uVar28 ^ 0x80000000;
      local_14a0._12_4_ = uVar35 ^ 0x80000000;
      local_14a0._16_4_ = uVar28 ^ 0x80000000;
      local_14a0._20_4_ = uVar35 ^ 0x80000000;
      local_14a0._24_4_ = uVar28 ^ 0x80000000;
      local_14a0._28_4_ = uVar35 ^ 0x80000000;
      auVar109 = ZEXT3264(local_14a0);
      uVar28 = auVar17._0_4_;
      uVar35 = auVar17._4_4_;
      local_14c0._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      local_14c0._8_4_ = uVar28 ^ 0x80000000;
      local_14c0._12_4_ = uVar35 ^ 0x80000000;
      local_14c0._16_4_ = uVar28 ^ 0x80000000;
      local_14c0._20_4_ = uVar35 ^ 0x80000000;
      local_14c0._24_4_ = uVar28 ^ 0x80000000;
      local_14c0._28_4_ = uVar35 ^ 0x80000000;
      auVar112 = ZEXT3264(local_14c0);
      local_1580 = (ulong)(((uint)(fVar61 < 0.0) << 5) >> 2);
      local_1588 = uVar39 >> 2;
      local_1590 = uVar37 >> 2;
      local_1598 = uVar36 >> 2;
      local_15a0 = uVar38 >> 2;
      local_13e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_13e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_1220 = vperm2f128_avx(local_13e0,mm_lookupmask_ps._0_32_,2);
      local_15a8 = uVar43 >> 2;
      auVar48._8_4_ = 0xbf800000;
      auVar48._0_8_ = 0xbf800000bf800000;
      auVar48._12_4_ = 0xbf800000;
      auVar48._16_4_ = 0xbf800000;
      auVar48._20_4_ = 0xbf800000;
      auVar48._24_4_ = 0xbf800000;
      auVar48._28_4_ = 0xbf800000;
      auVar62._8_4_ = 0x3f800000;
      auVar62._0_8_ = &DAT_3f8000003f800000;
      auVar62._12_4_ = 0x3f800000;
      auVar62._16_4_ = 0x3f800000;
      auVar62._20_4_ = 0x3f800000;
      auVar62._24_4_ = 0x3f800000;
      auVar62._28_4_ = 0x3f800000;
      _local_1240 = vblendvps_avx(auVar62,auVar48,local_1220);
      local_15c0 = uVar30;
      local_15c8 = uVar37;
      local_15d0 = uVar38;
      local_15d8 = uVar39;
      local_15e0 = uVar36;
      local_15e8 = uVar43;
      do {
        if (local_15b0 == local_1200) {
          return;
        }
        uVar40 = local_15b0[-1];
        local_15b0 = local_15b0 + -1;
        local_15b8 = unaff_R12;
        do {
          if ((uVar40 & 8) == 0) {
            auVar76 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar30),auVar106._0_32_
                                      ,auVar113._0_32_);
            auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar37),auVar109._0_32_
                                      ,auVar89._0_32_);
            auVar48 = vpmaxsd_avx2(ZEXT1632(auVar76),ZEXT1632(auVar14));
            auVar76 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar38),auVar112._0_32_
                                      ,auVar90._0_32_);
            auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar39),auVar106._0_32_
                                      ,auVar113._0_32_);
            auVar78 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar36),auVar109._0_32_
                                      ,auVar89._0_32_);
            auVar53 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar78));
            auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar40 + 0x40 + uVar43),auVar112._0_32_
                                      ,auVar90._0_32_);
            auVar62 = vpmaxsd_avx2(ZEXT1632(auVar76),auVar100._0_32_);
            auVar48 = vpmaxsd_avx2(auVar48,auVar62);
            auVar62 = vpminsd_avx2(ZEXT1632(auVar14),auVar104._0_32_);
            auVar62 = vpminsd_avx2(auVar53,auVar62);
            auVar48 = vpcmpgtd_avx2(auVar48,auVar62);
            uVar27 = vmovmskps_avx(auVar48);
            local_15b8 = (ulong)(byte)~(byte)uVar27;
          }
          if ((uVar40 & 8) == 0) {
            if (local_15b8 == 0) {
              iVar29 = 4;
            }
            else {
              uVar41 = uVar40 & 0xfffffffffffffff0;
              lVar33 = 0;
              for (uVar40 = local_15b8; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                  ) {
                lVar33 = lVar33 + 1;
              }
              iVar29 = 0;
              for (uVar32 = local_15b8 - 1 & local_15b8; uVar40 = *(ulong *)(uVar41 + lVar33 * 8),
                  uVar32 != 0; uVar32 = uVar32 - 1 & uVar32) {
                *local_15b0 = uVar40;
                local_15b0 = local_15b0 + 1;
                lVar33 = 0;
                for (uVar40 = uVar32; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
                {
                  lVar33 = lVar33 + 1;
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
        if (iVar29 == 6) {
          local_1570 = (ulong)((uint)uVar40 & 0xf) - 8;
          bVar46 = local_1570 != 0;
          if (bVar46) {
            local_1568 = 0;
            local_1578 = uVar40 & 0xfffffffffffffff0;
            do {
              lVar33 = local_1568 * 0x90;
              local_1548 = lVar33 + local_1578;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)(local_1578 + 0x40 + lVar33);
              auVar14 = vpmovzxbw_avx(auVar14);
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)(local_1578 + 0x48 + lVar33);
              auVar76 = vpmovzxbw_avx(auVar17);
              auVar76 = vpminuw_avx(auVar14,auVar76);
              auVar76 = vpcmpeqw_avx(auVar14,auVar76);
              auVar76 = vpacksswb_avx(auVar76,auVar76);
              uVar27 = *(undefined4 *)(local_1578 + 0x70 + lVar33);
              auVar53._4_4_ = uVar27;
              auVar53._0_4_ = uVar27;
              auVar53._8_4_ = uVar27;
              auVar53._12_4_ = uVar27;
              auVar53._16_4_ = uVar27;
              auVar53._20_4_ = uVar27;
              auVar53._24_4_ = uVar27;
              auVar53._28_4_ = uVar27;
              uVar27 = *(undefined4 *)(local_1578 + 0x7c + lVar33);
              auVar63._4_4_ = uVar27;
              auVar63._0_4_ = uVar27;
              auVar63._8_4_ = uVar27;
              auVar63._12_4_ = uVar27;
              auVar63._16_4_ = uVar27;
              auVar63._20_4_ = uVar27;
              auVar63._24_4_ = uVar27;
              auVar63._28_4_ = uVar27;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(local_1580 + 0x40 + local_1548);
              auVar48 = vpmovzxbd_avx2(auVar2);
              auVar48 = vcvtdq2ps_avx(auVar48);
              auVar14 = vfmadd213ps_fma(auVar48,auVar63,auVar53);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(local_1588 + 0x40 + local_1548);
              auVar48 = vpmovzxbd_avx2(auVar3);
              auVar48 = vcvtdq2ps_avx(auVar48);
              auVar78 = vfmadd213ps_fma(auVar48,auVar63,auVar53);
              uVar27 = *(undefined4 *)(local_1578 + 0x74 + lVar33);
              auVar54._4_4_ = uVar27;
              auVar54._0_4_ = uVar27;
              auVar54._8_4_ = uVar27;
              auVar54._12_4_ = uVar27;
              auVar54._16_4_ = uVar27;
              auVar54._20_4_ = uVar27;
              auVar54._24_4_ = uVar27;
              auVar54._28_4_ = uVar27;
              uVar27 = *(undefined4 *)(local_1578 + 0x80 + lVar33);
              auVar64._4_4_ = uVar27;
              auVar64._0_4_ = uVar27;
              auVar64._8_4_ = uVar27;
              auVar64._12_4_ = uVar27;
              auVar64._16_4_ = uVar27;
              auVar64._20_4_ = uVar27;
              auVar64._24_4_ = uVar27;
              auVar64._28_4_ = uVar27;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(local_1590 + 0x40 + local_1548);
              auVar48 = vpmovzxbd_avx2(auVar4);
              auVar48 = vcvtdq2ps_avx(auVar48);
              auVar79 = vfmadd213ps_fma(auVar48,auVar64,auVar54);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(local_1598 + 0x40 + local_1548);
              auVar48 = vpmovzxbd_avx2(auVar5);
              auVar48 = vcvtdq2ps_avx(auVar48);
              auVar17 = vfmadd213ps_fma(auVar48,auVar64,auVar54);
              uVar27 = *(undefined4 *)(local_1578 + 0x78 + lVar33);
              auVar55._4_4_ = uVar27;
              auVar55._0_4_ = uVar27;
              auVar55._8_4_ = uVar27;
              auVar55._12_4_ = uVar27;
              auVar55._16_4_ = uVar27;
              auVar55._20_4_ = uVar27;
              auVar55._24_4_ = uVar27;
              auVar55._28_4_ = uVar27;
              uVar27 = *(undefined4 *)(local_1578 + 0x84 + lVar33);
              auVar65._4_4_ = uVar27;
              auVar65._0_4_ = uVar27;
              auVar65._8_4_ = uVar27;
              auVar65._12_4_ = uVar27;
              auVar65._16_4_ = uVar27;
              auVar65._20_4_ = uVar27;
              auVar65._24_4_ = uVar27;
              auVar65._28_4_ = uVar27;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(local_15a0 + 0x40 + local_1548);
              auVar48 = vpmovzxbd_avx2(auVar6);
              auVar48 = vcvtdq2ps_avx(auVar48);
              auVar80 = vfmadd213ps_fma(auVar48,auVar65,auVar55);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)(local_15a8 + 0x40 + local_1548);
              auVar48 = vpmovzxbd_avx2(auVar7);
              auVar48 = vcvtdq2ps_avx(auVar48);
              auVar2 = vfmadd213ps_fma(auVar48,auVar65,auVar55);
              auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar113._0_32_,auVar106._0_32_);
              auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar89._0_32_,auVar109._0_32_);
              auVar48 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar79));
              auVar14 = vfmadd213ps_fma(ZEXT1632(auVar80),auVar90._0_32_,auVar112._0_32_);
              auVar78 = vfmadd213ps_fma(ZEXT1632(auVar78),auVar113._0_32_,auVar106._0_32_);
              auVar79 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar89._0_32_,auVar109._0_32_);
              auVar53 = vpminsd_avx2(ZEXT1632(auVar78),ZEXT1632(auVar79));
              auVar78 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar90._0_32_,auVar112._0_32_);
              auVar62 = vpmaxsd_avx2(ZEXT1632(auVar14),auVar100._0_32_);
              auVar48 = vpmaxsd_avx2(auVar48,auVar62);
              auVar62 = vpminsd_avx2(ZEXT1632(auVar78),auVar104._0_32_);
              auVar62 = vpminsd_avx2(auVar53,auVar62);
              auVar48 = vpcmpgtd_avx2(auVar48,auVar62);
              uVar27 = vmovmskps_avx(auVar48);
              bVar31 = ~(byte)uVar27 &
                       (SUB161(auVar76 >> 7,0) & 1 | (SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                        (SUB161(auVar76 >> 0x17,0) & 1) << 2 | (SUB161(auVar76 >> 0x1f,0) & 1) << 3
                        | (SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                        (SUB161(auVar76 >> 0x2f,0) & 1) << 5 | (SUB161(auVar76 >> 0x37,0) & 1) << 6
                       | SUB161(auVar76 >> 0x3f,0) << 7);
              if (bVar31 != 0) {
                uVar40 = (ulong)bVar31;
                local_1550 = context->scene;
                do {
                  lVar33 = 0;
                  for (uVar36 = uVar40; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000
                      ) {
                    lVar33 = lVar33 + 1;
                  }
                  uVar8 = *(ushort *)(local_1548 + lVar33 * 8);
                  uVar9 = *(ushort *)(local_1548 + 2 + lVar33 * 8);
                  local_1560 = (ulong)*(uint *)(local_1548 + 4 + lVar33 * 8);
                  local_1558 = (ulong)*(uint *)(local_1548 + 0x88);
                  pGVar10 = (local_1550->geometries).items[*(uint *)(local_1548 + 0x88)].ptr;
                  lVar33 = *(long *)&pGVar10->field_0x58;
                  lVar34 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_1560;
                  uVar35 = uVar8 & 0x7fff;
                  uVar45 = uVar9 & 0x7fff;
                  uVar28 = *(uint *)(lVar33 + 4 + lVar34);
                  uVar30 = (ulong)uVar28;
                  uVar37 = (ulong)(uVar28 * uVar45 + *(int *)(lVar33 + lVar34) + uVar35);
                  p_Var11 = pGVar10[1].intersectionFilterN;
                  lVar12 = *(long *)&pGVar10[1].time_range.upper;
                  auVar76 = *(undefined1 (*) [16])(lVar12 + (uVar37 + 1) * (long)p_Var11);
                  auVar14 = *(undefined1 (*) [16])(lVar12 + (uVar37 + uVar30) * (long)p_Var11);
                  lVar44 = uVar37 + uVar30 + 1;
                  auVar78 = *(undefined1 (*) [16])(lVar12 + lVar44 * (long)p_Var11);
                  auVar79 = *(undefined1 (*) [16])
                             (lVar12 + (uVar37 + (-1 < (short)uVar8) + 1) * (long)p_Var11);
                  lVar42 = (ulong)(-1 < (short)uVar8) + lVar44;
                  uVar36 = 0;
                  if (-1 < (short)uVar9) {
                    uVar36 = uVar30;
                  }
                  auVar17 = *(undefined1 (*) [16])(lVar12 + lVar42 * (long)p_Var11);
                  auVar80 = *(undefined1 (*) [16])
                             (lVar12 + (uVar37 + uVar30 + uVar36) * (long)p_Var11);
                  auVar2 = *(undefined1 (*) [16])(lVar12 + (lVar44 + uVar36) * (long)p_Var11);
                  auVar87._16_16_ =
                       *(undefined1 (*) [16])(lVar12 + (uVar36 + lVar42) * (long)p_Var11);
                  auVar87._0_16_ = auVar78;
                  auVar4 = vunpcklps_avx(auVar76,auVar17);
                  auVar3 = vunpckhps_avx(auVar76,auVar17);
                  auVar5 = vunpcklps_avx(auVar79,auVar78);
                  auVar79 = vunpckhps_avx(auVar79,auVar78);
                  auVar6 = vunpcklps_avx(auVar3,auVar79);
                  auVar7 = vunpcklps_avx(auVar4,auVar5);
                  auVar79 = vunpckhps_avx(auVar4,auVar5);
                  auVar4 = vunpcklps_avx(auVar14,auVar2);
                  auVar3 = vunpckhps_avx(auVar14,auVar2);
                  auVar5 = vunpcklps_avx(auVar78,auVar80);
                  auVar80 = vunpckhps_avx(auVar78,auVar80);
                  auVar3 = vunpcklps_avx(auVar3,auVar80);
                  auVar81 = vunpcklps_avx(auVar4,auVar5);
                  auVar80 = vunpckhps_avx(auVar4,auVar5);
                  auVar86._16_16_ = auVar2;
                  auVar86._0_16_ = auVar14;
                  auVar56._16_16_ = auVar17;
                  auVar56._0_16_ = auVar76;
                  auVar48 = vunpcklps_avx(auVar56,auVar86);
                  auVar49._16_16_ = auVar78;
                  auVar49._0_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var11 * uVar37);
                  auVar62 = vunpcklps_avx(auVar49,auVar87);
                  auVar15 = vunpcklps_avx(auVar62,auVar48);
                  auVar65 = vunpckhps_avx(auVar62,auVar48);
                  auVar48 = vunpckhps_avx(auVar56,auVar86);
                  auVar62 = vunpckhps_avx(auVar49,auVar87);
                  auVar16 = vunpcklps_avx(auVar62,auVar48);
                  auVar50._16_16_ = auVar7;
                  auVar50._0_16_ = auVar7;
                  auVar74._16_16_ = auVar79;
                  auVar74._0_16_ = auVar79;
                  auVar82._16_16_ = auVar6;
                  auVar82._0_16_ = auVar6;
                  auVar97._16_16_ = auVar81;
                  auVar97._0_16_ = auVar81;
                  auVar101._16_16_ = auVar80;
                  auVar101._0_16_ = auVar80;
                  auVar105._16_16_ = auVar3;
                  auVar105._0_16_ = auVar3;
                  auVar62 = vsubps_avx(auVar15,auVar50);
                  auVar48 = vsubps_avx(auVar65,auVar74);
                  auVar53 = vsubps_avx(auVar16,auVar82);
                  auVar54 = vsubps_avx(auVar97,auVar15);
                  auVar55 = vsubps_avx(auVar101,auVar65);
                  auVar63 = vsubps_avx(auVar105,auVar16);
                  auVar18._4_4_ = auVar48._4_4_ * auVar63._4_4_;
                  auVar18._0_4_ = auVar48._0_4_ * auVar63._0_4_;
                  auVar18._8_4_ = auVar48._8_4_ * auVar63._8_4_;
                  auVar18._12_4_ = auVar48._12_4_ * auVar63._12_4_;
                  auVar18._16_4_ = auVar48._16_4_ * auVar63._16_4_;
                  auVar18._20_4_ = auVar48._20_4_ * auVar63._20_4_;
                  auVar18._24_4_ = auVar48._24_4_ * auVar63._24_4_;
                  auVar18._28_4_ = auVar7._12_4_;
                  uVar27 = *(undefined4 *)&(ray->org).field_0;
                  auVar75._4_4_ = uVar27;
                  auVar75._0_4_ = uVar27;
                  auVar75._8_4_ = uVar27;
                  auVar75._12_4_ = uVar27;
                  auVar75._16_4_ = uVar27;
                  auVar75._20_4_ = uVar27;
                  auVar75._24_4_ = uVar27;
                  auVar75._28_4_ = uVar27;
                  uVar27 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
                  auVar107._4_4_ = uVar27;
                  auVar107._0_4_ = uVar27;
                  auVar107._8_4_ = uVar27;
                  auVar107._12_4_ = uVar27;
                  auVar107._16_4_ = uVar27;
                  auVar107._20_4_ = uVar27;
                  auVar107._24_4_ = uVar27;
                  auVar107._28_4_ = uVar27;
                  uVar27 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
                  auVar110._4_4_ = uVar27;
                  auVar110._0_4_ = uVar27;
                  auVar110._8_4_ = uVar27;
                  auVar110._12_4_ = uVar27;
                  auVar110._16_4_ = uVar27;
                  auVar110._20_4_ = uVar27;
                  auVar110._24_4_ = uVar27;
                  auVar110._28_4_ = uVar27;
                  fVar72 = (ray->dir).field_0.m128[0];
                  auVar98._4_4_ = fVar72;
                  auVar98._0_4_ = fVar72;
                  auVar98._8_4_ = fVar72;
                  auVar98._12_4_ = fVar72;
                  auVar98._16_4_ = fVar72;
                  auVar98._20_4_ = fVar72;
                  auVar98._24_4_ = fVar72;
                  auVar98._28_4_ = fVar72;
                  auVar79 = vfmsub231ps_fma(auVar18,auVar55,auVar53);
                  fVar61 = (ray->dir).field_0.m128[1];
                  auVar102._4_4_ = fVar61;
                  auVar102._0_4_ = fVar61;
                  auVar102._8_4_ = fVar61;
                  auVar102._12_4_ = fVar61;
                  auVar102._16_4_ = fVar61;
                  auVar102._20_4_ = fVar61;
                  auVar102._24_4_ = fVar61;
                  auVar102._28_4_ = fVar61;
                  auVar64 = vsubps_avx(auVar15,auVar75);
                  auVar19._4_4_ = auVar53._4_4_ * auVar54._4_4_;
                  auVar19._0_4_ = auVar53._0_4_ * auVar54._0_4_;
                  auVar19._8_4_ = auVar53._8_4_ * auVar54._8_4_;
                  auVar19._12_4_ = auVar53._12_4_ * auVar54._12_4_;
                  auVar19._16_4_ = auVar53._16_4_ * auVar54._16_4_;
                  auVar19._20_4_ = auVar53._20_4_ * auVar54._20_4_;
                  auVar19._24_4_ = auVar53._24_4_ * auVar54._24_4_;
                  auVar19._28_4_ = auVar15._28_4_;
                  auVar65 = vsubps_avx(auVar65,auVar107);
                  fVar94 = (ray->dir).field_0.m128[2];
                  auVar108._4_4_ = fVar94;
                  auVar108._0_4_ = fVar94;
                  auVar108._8_4_ = fVar94;
                  auVar108._12_4_ = fVar94;
                  auVar108._16_4_ = fVar94;
                  auVar108._20_4_ = fVar94;
                  auVar108._24_4_ = fVar94;
                  auVar108._28_4_ = fVar94;
                  auVar17 = vfmsub231ps_fma(auVar19,auVar63,auVar62);
                  auVar15 = vsubps_avx(auVar16,auVar110);
                  auVar16._4_4_ = fVar72 * auVar65._4_4_;
                  auVar16._0_4_ = fVar72 * auVar65._0_4_;
                  auVar16._8_4_ = fVar72 * auVar65._8_4_;
                  auVar16._12_4_ = fVar72 * auVar65._12_4_;
                  auVar16._16_4_ = fVar72 * auVar65._16_4_;
                  auVar16._20_4_ = fVar72 * auVar65._20_4_;
                  auVar16._24_4_ = fVar72 * auVar65._24_4_;
                  auVar16._28_4_ = uVar27;
                  auVar76 = vfmsub231ps_fma(auVar16,auVar64,auVar102);
                  auVar20._4_4_ = auVar63._4_4_ * auVar76._4_4_;
                  auVar20._0_4_ = auVar63._0_4_ * auVar76._0_4_;
                  auVar20._8_4_ = auVar63._8_4_ * auVar76._8_4_;
                  auVar20._12_4_ = auVar63._12_4_ * auVar76._12_4_;
                  auVar20._16_4_ = auVar63._16_4_ * 0.0;
                  auVar20._20_4_ = auVar63._20_4_ * 0.0;
                  auVar20._24_4_ = auVar63._24_4_ * 0.0;
                  auVar20._28_4_ = auVar63._28_4_;
                  auVar111._0_4_ = auVar53._0_4_ * auVar76._0_4_;
                  auVar111._4_4_ = auVar53._4_4_ * auVar76._4_4_;
                  auVar111._8_4_ = auVar53._8_4_ * auVar76._8_4_;
                  auVar111._12_4_ = auVar53._12_4_ * auVar76._12_4_;
                  auVar111._16_4_ = auVar53._16_4_ * 0.0;
                  auVar111._20_4_ = auVar53._20_4_ * 0.0;
                  auVar111._24_4_ = auVar53._24_4_ * 0.0;
                  auVar111._28_4_ = 0;
                  auVar21._4_4_ = fVar94 * auVar64._4_4_;
                  auVar21._0_4_ = fVar94 * auVar64._0_4_;
                  auVar21._8_4_ = fVar94 * auVar64._8_4_;
                  auVar21._12_4_ = fVar94 * auVar64._12_4_;
                  auVar21._16_4_ = fVar94 * auVar64._16_4_;
                  auVar21._20_4_ = fVar94 * auVar64._20_4_;
                  auVar21._24_4_ = fVar94 * auVar64._24_4_;
                  auVar21._28_4_ = auVar53._28_4_;
                  auVar14 = vfmsub231ps_fma(auVar21,auVar15,auVar98);
                  auVar76 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar14),auVar55);
                  auVar14 = vfmadd231ps_fma(auVar111,auVar48,ZEXT1632(auVar14));
                  auVar22._4_4_ = auVar62._4_4_ * auVar55._4_4_;
                  auVar22._0_4_ = auVar62._0_4_ * auVar55._0_4_;
                  auVar22._8_4_ = auVar62._8_4_ * auVar55._8_4_;
                  auVar22._12_4_ = auVar62._12_4_ * auVar55._12_4_;
                  auVar22._16_4_ = auVar62._16_4_ * auVar55._16_4_;
                  auVar22._20_4_ = auVar62._20_4_ * auVar55._20_4_;
                  auVar22._24_4_ = auVar62._24_4_ * auVar55._24_4_;
                  auVar22._28_4_ = auVar55._28_4_;
                  auVar78 = vfmsub231ps_fma(auVar22,auVar54,auVar48);
                  auVar23._4_4_ = fVar61 * auVar15._4_4_;
                  auVar23._0_4_ = fVar61 * auVar15._0_4_;
                  auVar23._8_4_ = fVar61 * auVar15._8_4_;
                  auVar23._12_4_ = fVar61 * auVar15._12_4_;
                  auVar23._16_4_ = fVar61 * auVar15._16_4_;
                  auVar23._20_4_ = fVar61 * auVar15._20_4_;
                  auVar23._24_4_ = fVar61 * auVar15._24_4_;
                  auVar23._28_4_ = auVar48._28_4_;
                  auVar80 = vfmsub231ps_fma(auVar23,auVar65,auVar108);
                  fVar72 = auVar78._0_4_;
                  fVar61 = auVar78._4_4_;
                  auVar24._4_4_ = fVar94 * fVar61;
                  auVar24._0_4_ = fVar94 * fVar72;
                  fVar67 = auVar78._8_4_;
                  auVar24._8_4_ = fVar94 * fVar67;
                  fVar68 = auVar78._12_4_;
                  auVar24._12_4_ = fVar94 * fVar68;
                  auVar24._16_4_ = fVar94 * 0.0;
                  auVar24._20_4_ = fVar94 * 0.0;
                  auVar24._24_4_ = fVar94 * 0.0;
                  auVar24._28_4_ = fVar94;
                  auVar78 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar17),auVar102);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),ZEXT1632(auVar79),auVar98);
                  auVar99._8_4_ = 0x7fffffff;
                  auVar99._0_8_ = 0x7fffffff7fffffff;
                  auVar99._12_4_ = 0x7fffffff;
                  auVar99._16_4_ = 0x7fffffff;
                  auVar99._20_4_ = 0x7fffffff;
                  auVar99._24_4_ = 0x7fffffff;
                  auVar99._28_4_ = 0x7fffffff;
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar80),auVar54);
                  auVar83._8_8_ = 0x8000000080000000;
                  auVar83._0_8_ = 0x8000000080000000;
                  auVar83._16_8_ = 0x8000000080000000;
                  auVar83._24_8_ = 0x8000000080000000;
                  auVar48 = vandps_avx(ZEXT1632(auVar78),auVar83);
                  uVar28 = auVar48._0_4_;
                  auVar84._0_4_ = (float)(uVar28 ^ auVar76._0_4_);
                  uVar91 = auVar48._4_4_;
                  auVar84._4_4_ = (float)(uVar91 ^ auVar76._4_4_);
                  uVar92 = auVar48._8_4_;
                  auVar84._8_4_ = (float)(uVar92 ^ auVar76._8_4_);
                  uVar93 = auVar48._12_4_;
                  auVar84._12_4_ = (float)(uVar93 ^ auVar76._12_4_);
                  fVar94 = auVar48._16_4_;
                  auVar84._16_4_ = fVar94;
                  fVar95 = auVar48._20_4_;
                  auVar84._20_4_ = fVar95;
                  fVar96 = auVar48._24_4_;
                  auVar84._24_4_ = fVar96;
                  fVar69 = auVar48._28_4_;
                  auVar84._28_4_ = fVar69;
                  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar62,ZEXT1632(auVar80));
                  auVar88._0_4_ = (float)(uVar28 ^ auVar76._0_4_);
                  auVar88._4_4_ = (float)(uVar91 ^ auVar76._4_4_);
                  auVar88._8_4_ = (float)(uVar92 ^ auVar76._8_4_);
                  auVar88._12_4_ = (float)(uVar93 ^ auVar76._12_4_);
                  auVar88._16_4_ = fVar94;
                  auVar88._20_4_ = fVar95;
                  auVar88._24_4_ = fVar96;
                  auVar88._28_4_ = fVar69;
                  auVar48 = vcmpps_avx(auVar84,ZEXT832(0) << 0x20,5);
                  auVar62 = vcmpps_avx(auVar88,ZEXT832(0) << 0x20,5);
                  auVar48 = vandps_avx(auVar62,auVar48);
                  local_1360 = vandps_avx(ZEXT1632(auVar78),auVar99);
                  auVar62 = vcmpps_avx(ZEXT1632(auVar78),ZEXT832(0) << 0x20,4);
                  auVar48 = vandps_avx(auVar48,auVar62);
                  auVar103._0_4_ = auVar88._0_4_ + auVar84._0_4_;
                  auVar103._4_4_ = auVar88._4_4_ + auVar84._4_4_;
                  auVar103._8_4_ = auVar88._8_4_ + auVar84._8_4_;
                  auVar103._12_4_ = auVar88._12_4_ + auVar84._12_4_;
                  auVar103._16_4_ = fVar94 + fVar94;
                  auVar103._20_4_ = fVar95 + fVar95;
                  auVar103._24_4_ = fVar96 + fVar96;
                  auVar103._28_4_ = fVar69 + fVar69;
                  auVar62 = vcmpps_avx(auVar103,local_1360,2);
                  auVar48 = vandps_avx(auVar48,auVar62);
                  auVar62 = local_13e0 & auVar48;
                  if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar62 >> 0x7f,0) != '\0') ||
                        (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar62 >> 0xbf,0) != '\0') ||
                      (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar62[0x1f] < '\0') {
                    auVar48 = vandps_avx(auVar48,local_13e0);
                    auVar25._4_4_ = fVar61 * auVar15._4_4_;
                    auVar25._0_4_ = fVar72 * auVar15._0_4_;
                    auVar25._8_4_ = fVar67 * auVar15._8_4_;
                    auVar25._12_4_ = fVar68 * auVar15._12_4_;
                    auVar25._16_4_ = auVar15._16_4_ * 0.0;
                    auVar25._20_4_ = auVar15._20_4_ * 0.0;
                    auVar25._24_4_ = auVar15._24_4_ * 0.0;
                    auVar25._28_4_ = auVar15._28_4_;
                    auVar76 = vfmadd213ps_fma(auVar65,ZEXT1632(auVar17),auVar25);
                    auVar76 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar79),ZEXT1632(auVar76));
                    local_1380._0_4_ = (float)(uVar28 ^ auVar76._0_4_);
                    local_1380._4_4_ = (float)(uVar91 ^ auVar76._4_4_);
                    local_1380._8_4_ = (float)(uVar92 ^ auVar76._8_4_);
                    local_1380._12_4_ = (float)(uVar93 ^ auVar76._12_4_);
                    local_1380._16_4_ = fVar94;
                    local_1380._20_4_ = fVar95;
                    local_1380._24_4_ = fVar96;
                    local_1380._28_4_ = fVar69;
                    fVar69 = (ray->org).field_0.m128[3];
                    fVar70 = local_1360._0_4_;
                    fVar71 = local_1360._4_4_;
                    auVar15._4_4_ = fVar71 * fVar69;
                    auVar15._0_4_ = fVar70 * fVar69;
                    fVar52 = local_1360._8_4_;
                    auVar15._8_4_ = fVar52 * fVar69;
                    fVar57 = local_1360._12_4_;
                    auVar15._12_4_ = fVar57 * fVar69;
                    fVar58 = local_1360._16_4_;
                    auVar15._16_4_ = fVar58 * fVar69;
                    fVar59 = local_1360._20_4_;
                    auVar15._20_4_ = fVar59 * fVar69;
                    fVar60 = local_1360._24_4_;
                    auVar15._24_4_ = fVar60 * fVar69;
                    auVar15._28_4_ = fVar69;
                    auVar62 = vcmpps_avx(auVar15,local_1380,1);
                    fVar69 = ray->tfar;
                    auVar26._4_4_ = fVar71 * fVar69;
                    auVar26._0_4_ = fVar70 * fVar69;
                    auVar26._8_4_ = fVar52 * fVar69;
                    auVar26._12_4_ = fVar57 * fVar69;
                    auVar26._16_4_ = fVar58 * fVar69;
                    auVar26._20_4_ = fVar59 * fVar69;
                    auVar26._24_4_ = fVar60 * fVar69;
                    auVar26._28_4_ = fVar69;
                    auVar53 = vcmpps_avx(local_1380,auVar26,2);
                    auVar62 = vandps_avx(auVar53,auVar62);
                    auVar53 = auVar48 & auVar62;
                    if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar53 >> 0x7f,0) != '\0') ||
                          (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar53 >> 0xbf,0) != '\0') ||
                        (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar53[0x1f] < '\0') {
                      local_1320 = vandps_avx(auVar48,auVar62);
                      auVar48 = vsubps_avx(local_1360,auVar88);
                      auVar48 = vblendvps_avx(auVar84,auVar48,local_1220);
                      auVar62 = vsubps_avx(local_1360,auVar84);
                      auVar62 = vblendvps_avx(auVar88,auVar62,local_1220);
                      local_12a0._0_4_ = (float)local_1240._0_4_ * auVar79._0_4_;
                      local_12a0._4_4_ = (float)local_1240._4_4_ * auVar79._4_4_;
                      local_12a0._8_4_ = fStack_1238 * auVar79._8_4_;
                      local_12a0._12_4_ = fStack_1234 * auVar79._12_4_;
                      local_12a0._16_4_ = fStack_1230 * 0.0;
                      local_12a0._20_4_ = fStack_122c * 0.0;
                      local_12a0._24_4_ = fStack_1228 * 0.0;
                      local_12a0._28_4_ = 0;
                      local_1280._4_4_ = (float)local_1240._4_4_ * auVar17._4_4_;
                      local_1280._0_4_ = (float)local_1240._0_4_ * auVar17._0_4_;
                      local_1280._8_4_ = fStack_1238 * auVar17._8_4_;
                      local_1280._12_4_ = fStack_1234 * auVar17._12_4_;
                      local_1280._16_4_ = fStack_1230 * 0.0;
                      local_1280._20_4_ = fStack_122c * 0.0;
                      local_1280._24_4_ = fStack_1228 * 0.0;
                      local_1280._28_4_ = 0;
                      local_1260._4_4_ = (float)local_1240._4_4_ * fVar61;
                      local_1260._0_4_ = (float)local_1240._0_4_ * fVar72;
                      local_1260._8_4_ = fStack_1238 * fVar67;
                      local_1260._12_4_ = fStack_1234 * fVar68;
                      local_1260._16_4_ = fStack_1230 * 0.0;
                      local_1260._20_4_ = fStack_122c * 0.0;
                      local_1260._24_4_ = fStack_1228 * 0.0;
                      local_1260._28_4_ = 0;
                      auVar51._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                      auVar51._8_4_ = uVar35;
                      auVar51._12_4_ = uVar35;
                      auVar51._16_4_ = uVar35;
                      auVar51._20_4_ = uVar35;
                      auVar51._24_4_ = uVar35;
                      auVar51._28_4_ = uVar35;
                      auVar53 = vpaddd_avx2(auVar51,_DAT_0205d4c0);
                      auVar81._0_4_ = (float)(int)(*(ushort *)(lVar33 + 8 + lVar34) - 1);
                      auVar81._4_12_ = auVar113._4_12_;
                      auVar66._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                      auVar66._8_4_ = uVar45;
                      auVar66._12_4_ = uVar45;
                      auVar66._16_4_ = uVar45;
                      auVar66._20_4_ = uVar45;
                      auVar66._24_4_ = uVar45;
                      auVar66._28_4_ = uVar45;
                      auVar54 = vpaddd_avx2(auVar66,_DAT_0205d4e0);
                      auVar76 = vrcpss_avx(auVar81,auVar81);
                      auVar85._0_4_ = (float)(int)(*(ushort *)(lVar33 + 10 + lVar34) - 1);
                      auVar85._4_12_ = auVar113._4_12_;
                      auVar14 = vfnmadd213ss_fma(auVar81,auVar76,SUB6416(ZEXT464(0x40000000),0));
                      fStack_13a8 = auVar76._0_4_ * auVar14._0_4_;
                      auVar76 = vrcpss_avx(auVar85,auVar85);
                      auVar14 = vfnmadd213ss_fma(auVar85,auVar76,SUB6416(ZEXT464(0x40000000),0));
                      fVar72 = auVar76._0_4_ * auVar14._0_4_;
                      auVar53 = vcvtdq2ps_avx(auVar53);
                      fStack_13a4 = auVar53._28_4_ + auVar48._28_4_;
                      local_13c0 = (fVar70 * auVar53._0_4_ + auVar48._0_4_) * fStack_13a8;
                      fStack_13bc = (fVar71 * auVar53._4_4_ + auVar48._4_4_) * fStack_13a8;
                      fStack_13b8 = (fVar52 * auVar53._8_4_ + auVar48._8_4_) * fStack_13a8;
                      fStack_13b4 = (fVar57 * auVar53._12_4_ + auVar48._12_4_) * fStack_13a8;
                      fStack_13b0 = (fVar58 * auVar53._16_4_ + auVar48._16_4_) * fStack_13a8;
                      fStack_13ac = (fVar59 * auVar53._20_4_ + auVar48._20_4_) * fStack_13a8;
                      fStack_13a8 = (fVar60 * auVar53._24_4_ + auVar48._24_4_) * fStack_13a8;
                      auVar48 = vcvtdq2ps_avx(auVar54);
                      fVar61 = (fVar70 * auVar48._0_4_ + auVar62._0_4_) * fVar72;
                      fVar67 = (fVar71 * auVar48._4_4_ + auVar62._4_4_) * fVar72;
                      local_13a0._4_4_ = fVar67;
                      local_13a0._0_4_ = fVar61;
                      fVar68 = (fVar52 * auVar48._8_4_ + auVar62._8_4_) * fVar72;
                      local_13a0._8_4_ = fVar68;
                      fVar69 = (fVar57 * auVar48._12_4_ + auVar62._12_4_) * fVar72;
                      local_13a0._12_4_ = fVar69;
                      fVar70 = (fVar58 * auVar48._16_4_ + auVar62._16_4_) * fVar72;
                      local_13a0._16_4_ = fVar70;
                      fVar71 = (fVar59 * auVar48._20_4_ + auVar62._20_4_) * fVar72;
                      local_13a0._20_4_ = fVar71;
                      fVar72 = (fVar60 * auVar48._24_4_ + auVar62._24_4_) * fVar72;
                      local_13a0._24_4_ = fVar72;
                      local_13a0._28_4_ = auVar48._28_4_ + auVar62._28_4_;
                      if ((pGVar10->mask & ray->mask) != 0) {
                        pRVar13 = context->args;
                        if ((pRVar13->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0053430c:
                          auVar89 = ZEXT3264(local_1400);
                          auVar90 = ZEXT3264(local_1420);
                          auVar100 = ZEXT3264(local_1440);
                          auVar104 = ZEXT3264(local_1460);
                          auVar106 = ZEXT3264(local_1480);
                          auVar109 = ZEXT3264(local_14a0);
                          auVar112 = ZEXT3264(local_14c0);
                          goto LAB_005342bc;
                        }
                        auVar48 = vrcpps_avx(local_1360);
                        auVar77._8_4_ = 0x3f800000;
                        auVar77._0_8_ = &DAT_3f8000003f800000;
                        auVar77._12_4_ = 0x3f800000;
                        auVar77._16_4_ = 0x3f800000;
                        auVar77._20_4_ = 0x3f800000;
                        auVar77._24_4_ = 0x3f800000;
                        auVar77._28_4_ = 0x3f800000;
                        auVar76 = vfnmadd213ps_fma(local_1360,auVar48,auVar77);
                        auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar48,auVar48);
                        fVar52 = auVar76._0_4_;
                        fVar57 = auVar76._4_4_;
                        fVar58 = auVar76._8_4_;
                        fVar59 = auVar76._12_4_;
                        local_12c0[0] = fVar52 * local_1380._0_4_;
                        local_12c0[1] = fVar57 * local_1380._4_4_;
                        local_12c0[2] = fVar58 * local_1380._8_4_;
                        local_12c0[3] = fVar59 * local_1380._12_4_;
                        fStack_12b0 = fVar94 * 0.0;
                        fStack_12ac = fVar95 * 0.0;
                        fStack_12a8 = fVar96 * 0.0;
                        uStack_12a4 = auVar48._28_4_;
                        local_1300[0] = local_13c0 * fVar52;
                        local_1300[1] = fStack_13bc * fVar57;
                        local_1300[2] = fStack_13b8 * fVar58;
                        local_1300[3] = fStack_13b4 * fVar59;
                        fStack_12f0 = fStack_13b0 * 0.0;
                        fStack_12ec = fStack_13ac * 0.0;
                        fStack_12e8 = fStack_13a8 * 0.0;
                        fStack_12e4 = fStack_13a4;
                        local_12e0[0] = fVar61 * fVar52;
                        local_12e0[1] = fVar67 * fVar57;
                        local_12e0[2] = fVar68 * fVar58;
                        local_12e0[3] = fVar69 * fVar59;
                        fStack_12d0 = fVar70 * 0.0;
                        fStack_12cc = fVar71 * 0.0;
                        fStack_12c8 = fVar72 * 0.0;
                        fStack_12c4 = fStack_13a4;
                        uVar28 = vmovmskps_avx(local_1320);
                        bVar47 = uVar28 == 0;
                        if (!bVar47) {
                          uVar36 = 0;
                          uVar37 = (ulong)(uVar28 & 0xff);
                          for (uVar30 = uVar37; (uVar30 & 1) == 0;
                              uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                            uVar36 = uVar36 + 1;
                          }
                          local_15f0 = context->user;
                          local_14e0 = auVar113._0_32_;
                          do {
                            local_1534 = local_1300[uVar36];
                            local_1530 = local_12e0[uVar36];
                            fVar72 = ray->tfar;
                            ray->tfar = local_12c0[uVar36];
                            local_1540 = *(undefined4 *)(local_12a0 + uVar36 * 4);
                            local_153c = *(undefined4 *)(local_1280 + uVar36 * 4);
                            local_1538 = *(undefined4 *)(local_1260 + uVar36 * 4);
                            local_152c = (int)local_1560;
                            local_1528 = (int)local_1558;
                            local_1524 = local_15f0->instID[0];
                            local_1520 = local_15f0->instPrimID[0];
                            local_15f4 = -1;
                            local_1510.valid = &local_15f4;
                            local_1510.geometryUserPtr = pGVar10->userPtr;
                            local_1510.context = local_15f0;
                            local_1510.ray = (RTCRayN *)ray;
                            local_1510.hit = (RTCHitN *)&local_1540;
                            local_1510.N = 1;
                            if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar10->occlusionFilterN)(&local_1510), *local_1510.valid != 0))
                            {
                              if (pRVar13->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar13->filter)(&local_1510);
                                }
                                if (*local_1510.valid == 0) goto LAB_00534205;
                              }
                              auVar113 = ZEXT3264(local_14e0);
                              if (!bVar47) goto LAB_0053430c;
                              break;
                            }
LAB_00534205:
                            ray->tfar = fVar72;
                            uVar30 = uVar36 & 0x3f;
                            uVar36 = 0;
                            uVar37 = uVar37 ^ 1L << uVar30;
                            for (uVar30 = uVar37; (uVar30 & 1) == 0;
                                uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                              uVar36 = uVar36 + 1;
                            }
                            bVar47 = uVar37 == 0;
                            auVar113 = ZEXT3264(local_14e0);
                          } while (!bVar47);
                        }
                      }
                    }
                  }
                  uVar40 = uVar40 - 1 & uVar40;
                } while (uVar40 != 0);
              }
              local_1568 = local_1568 + 1;
              bVar46 = local_1568 < local_1570;
              auVar89 = ZEXT3264(local_1400);
              auVar90 = ZEXT3264(local_1420);
              auVar100 = ZEXT3264(local_1440);
              auVar104 = ZEXT3264(local_1460);
              auVar106 = ZEXT3264(local_1480);
              auVar109 = ZEXT3264(local_14a0);
              auVar112 = ZEXT3264(local_14c0);
            } while (local_1568 != local_1570);
          }
LAB_005342bc:
          iVar29 = 0;
          uVar36 = local_15e0;
          uVar30 = local_15c0;
          uVar37 = local_15c8;
          uVar38 = local_15d0;
          uVar39 = local_15d8;
          uVar43 = local_15e8;
          if (bVar46) {
            ray->tfar = -INFINITY;
            iVar29 = 3;
          }
        }
        unaff_R12 = local_15b8;
      } while (iVar29 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }